

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressSeqStore_singleBlock
                 (ZSTD_CCtx *zc,seqStore_t *seqStore,repcodes_t *dRep,repcodes_t *cRep,void *dst,
                 size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock,U32 isPartition)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  U32 UVar4;
  U32 UVar5;
  undefined8 uVar6;
  seqDef *psVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  U32 *pUVar13;
  U32 UVar14;
  uint uVar15;
  size_t err_code;
  ulong uVar16;
  uint uVar17;
  U32 UVar18;
  uint uVar19;
  size_t err_code_1;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  int in_stack_ffffffffffffffa0;
  BYTE *op;
  repcodes_t dRepOriginal;
  
  UVar4 = dRep->rep[2];
  uVar6 = *(undefined8 *)dRep->rep;
  if ((isPartition != 0) &&
     (uVar11 = (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3,
     (int)uVar11 != 0)) {
    uVar16 = 0;
    do {
      psVar7 = seqStore->sequencesStart;
      bVar22 = psVar7[uVar16].litLength == 0;
      UVar5 = psVar7[uVar16].offset;
      uVar19 = UVar5 - 1;
      uVar21 = (uint)bVar22;
      UVar18 = UVar5;
      if (uVar19 < 3) {
        uVar17 = uVar19 + bVar22;
        if (uVar17 == 3) {
          UVar18 = dRep->rep[0] - 1;
          UVar14 = cRep->rep[0] - 1;
        }
        else {
          UVar18 = dRep->rep[uVar17];
          UVar14 = cRep->rep[uVar17];
        }
        uVar15 = uVar19;
        if (UVar18 != UVar14) {
          UVar18 = UVar14 + 3;
          psVar7[uVar16].offset = UVar18;
          uVar15 = UVar14 + 2;
          if (2 < UVar14 + 2) goto LAB_00622ff4;
        }
        uVar15 = uVar15 + uVar21;
        if (uVar15 == 0) {
          uVar12 = *(ulong *)dRep->rep;
          uVar20 = uVar12 >> 0x20;
          pUVar13 = dRep->rep + 2;
        }
        else {
          if (uVar15 == 3) {
            uVar21 = dRep->rep[0];
            uVar19 = uVar21 - 1;
          }
          else {
            uVar19 = dRep->rep[uVar15];
            uVar21 = dRep->rep[0];
          }
          uVar12 = (ulong)uVar19;
          uVar20 = (ulong)uVar21;
          pUVar13 = dRep->rep + (ulong)(uVar15 == 1) + 1;
        }
        UVar18 = *pUVar13;
        *(ulong *)dRep->rep = uVar12 & 0xffffffff | uVar20 << 0x20;
        dRep->rep[2] = UVar18;
LAB_00623076:
        if (uVar17 == 0) {
          uVar12 = *(ulong *)cRep->rep;
          uVar20 = uVar12 >> 0x20;
          pUVar13 = cRep->rep + 2;
        }
        else {
          if (uVar17 == 3) {
            uVar21 = cRep->rep[0];
            uVar19 = uVar21 - 1;
          }
          else {
            uVar19 = cRep->rep[uVar17];
            uVar21 = cRep->rep[0];
          }
          uVar20 = (ulong)uVar21;
          uVar12 = (ulong)uVar19;
          pUVar13 = cRep->rep + (ulong)(uVar17 == 1) + 1;
        }
      }
      else {
LAB_00622ff4:
        UVar14 = dRep->rep[1];
        *(ulong *)dRep->rep = CONCAT44(dRep->rep[0],UVar18 - 3);
        dRep->rep[2] = UVar14;
        if (uVar19 < 3) {
          uVar17 = uVar19 + uVar21;
          goto LAB_00623076;
        }
        uVar20 = (ulong)cRep->rep[0];
        uVar12 = (ulong)(UVar5 - 3);
        pUVar13 = cRep->rep + 1;
      }
      UVar18 = *pUVar13;
      *(ulong *)cRep->rep = uVar12 & 0xffffffff | uVar20 << 0x20;
      cRep->rep[2] = UVar18;
      uVar16 = uVar16 + 1;
    } while ((uVar11 & 0xffffffff) != uVar16);
  }
  sVar10 = ZSTD_entropyCompressSeqStore
                     (seqStore,&((zc->blockState).prevCBlock)->entropy,
                      &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                      (void *)((long)dst + 3),dstCapacity - 3,srcSize,zc->entropyWorkspace,
                      (ulong)(uint)zc->bmi2,in_stack_ffffffffffffffa0);
  if (sVar10 < 0xffffffffffffff89) {
    if (((sVar10 < 0x19) && (zc->isFirstBlock == 0)) &&
       (iVar9 = ZSTD_isRLE((BYTE *)src,srcSize), iVar9 != 0)) {
      sVar10 = 1;
    }
    if ((zc->seqCollector).collectSequences == 0) {
      pZVar8 = (zc->blockState).prevCBlock;
      if ((pZVar8->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
        (pZVar8->entropy).fse.offcode_repeatMode = FSE_repeat_check;
      }
      if (sVar10 == 1) {
        sVar10 = 0xffffffffffffffba;
        if (3 < dstCapacity) {
          uVar3 = *src;
          iVar9 = lastBlock + (int)srcSize * 8 + 2;
          *(short *)dst = (short)iVar9;
          *(char *)((long)dst + 2) = (char)((uint)iVar9 >> 0x10);
          *(undefined1 *)((long)dst + 3) = uVar3;
          dRep->rep[2] = UVar4;
          *(undefined8 *)dRep->rep = uVar6;
          sVar10 = 4;
        }
      }
      else if (sVar10 == 0) {
        uVar11 = srcSize + 3;
        sVar10 = 0xffffffffffffffba;
        if (uVar11 <= dstCapacity) {
          iVar9 = lastBlock + (int)srcSize * 8;
          *(short *)dst = (short)iVar9;
          *(char *)((long)dst + 2) = (char)((uint)iVar9 >> 0x10);
          memcpy((void *)((long)dst + 3),src,srcSize);
          sVar10 = uVar11;
          if (uVar11 < 0xffffffffffffff89) {
            dRep->rep[2] = UVar4;
            *(undefined8 *)dRep->rep = uVar6;
          }
        }
      }
      else {
        (zc->blockState).prevCBlock = (zc->blockState).nextCBlock;
        (zc->blockState).nextCBlock = pZVar8;
        iVar9 = lastBlock + (int)sVar10 * 8 + 4;
        *(short *)dst = (short)iVar9;
        *(char *)((long)dst + 2) = (char)((uint)iVar9 >> 0x10);
        sVar10 = sVar10 + 3;
      }
    }
    else {
      ZSTD_copyBlockSequences(zc);
      uVar1 = (zc->blockState).prevCBlock;
      uVar2 = (zc->blockState).nextCBlock;
      auVar23._8_4_ = (int)uVar1;
      auVar23._0_8_ = uVar2;
      auVar23._12_4_ = (int)((ulong)uVar1 >> 0x20);
      (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar2;
      (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar23._8_8_;
      sVar10 = 0;
    }
  }
  return sVar10;
}

Assistant:

static size_t ZSTD_compressSeqStore_singleBlock(ZSTD_CCtx* zc, seqStore_t* const seqStore,
                                                repcodes_t* const dRep, repcodes_t* const cRep,
                                                void* dst, size_t dstCapacity,
                                                const void* src, size_t srcSize,
                                                U32 lastBlock, U32 isPartition) {
    const U32 rleMaxLength = 25;
    BYTE* op = (BYTE*)dst;
    const BYTE* ip = (const BYTE*)src;
    size_t cSize;
    size_t cSeqsSize;

    /* In case of an RLE or raw block, the simulated decompression repcode history must be reset */
    repcodes_t const dRepOriginal = *dRep;
    if (isPartition)
        ZSTD_seqStore_resolveOffCodes(dRep, cRep, seqStore, (U32)(seqStore->sequences - seqStore->sequencesStart));

    cSeqsSize = ZSTD_entropyCompressSeqStore(seqStore,
                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                &zc->appliedParams,
                op + ZSTD_blockHeaderSize, dstCapacity - ZSTD_blockHeaderSize,
                srcSize,
                zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                zc->bmi2);
    FORWARD_IF_ERROR(cSeqsSize, "ZSTD_entropyCompressSeqStore failed!");

    if (!zc->isFirstBlock &&
        cSeqsSize < rleMaxLength &&
        ZSTD_isRLE((BYTE const*)src, srcSize)) {
        /* We don't want to emit our first block as a RLE even if it qualifies because
        * doing so will cause the decoder (cli only) to throw a "should consume all input error."
        * This is only an issue for zstd <= v1.4.3
        */
        cSeqsSize = 1;
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    if (cSeqsSize == 0) {
        cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "Nocompress block failed");
        DEBUGLOG(4, "Writing out nocompress block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else if (cSeqsSize == 1) {
        cSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "RLE compress block failed");
        DEBUGLOG(4, "Writing out RLE block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        writeBlockHeader(op, cSeqsSize, srcSize, lastBlock);
        cSize = ZSTD_blockHeaderSize + cSeqsSize;
        DEBUGLOG(4, "Writing out compressed block, size: %zu", cSize);
    }
    return cSize;
}